

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

_Bool f32_is_zon3(union_float32 a,union_float32 b,union_float32 c)

{
  _Bool _Var1;
  undefined1 local_15;
  union_float32 c_local;
  union_float32 b_local;
  union_float32 a_local;
  
  _Var1 = float32_is_zero_or_normal(a.s);
  local_15 = false;
  if (_Var1) {
    _Var1 = float32_is_zero_or_normal(b.s);
    local_15 = false;
    if (_Var1) {
      local_15 = float32_is_zero_or_normal(c.s);
    }
  }
  return local_15;
}

Assistant:

static inline
bool f32_is_zon3(union_float32 a, union_float32 b, union_float32 c)
{
    if (QEMU_HARDFLOAT_3F32_USE_FP) {
        return (fpclassify(a.h) == FP_NORMAL || fpclassify(a.h) == FP_ZERO) &&
               (fpclassify(b.h) == FP_NORMAL || fpclassify(b.h) == FP_ZERO) &&
               (fpclassify(c.h) == FP_NORMAL || fpclassify(c.h) == FP_ZERO);
    }
    return float32_is_zero_or_normal(a.s) &&
           float32_is_zero_or_normal(b.s) &&
           float32_is_zero_or_normal(c.s);
}